

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void sha2_256(void *key,int len,uint32_t seed,void *out)

{
  sha256_init(&ltc_state);
  ltc_state.sha256.state[0] = seed ^ 0x6a09e667;
  sha256_process(&ltc_state,(uchar *)key,(long)len);
  sha256_done(&ltc_state,(uchar *)out);
  return;
}

Assistant:

inline void sha2_256(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  sha256_init(&ltc_state);
  ltc_state.sha256.state[0] = 0x6A09E667UL ^ seed;
  sha256_process(&ltc_state, (unsigned char *)key, len);
  sha256_done(&ltc_state, (unsigned char *)out);
}